

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

uv_signal_t * uv__signal_first_handle(int signum)

{
  int iVar1;
  long lVar2;
  uv_signal_t *puVar3;
  uv__signal_tree_s *puVar4;
  uv_signal_t *puVar5;
  uv_signal_t *w2;
  uv_signal_t lookup;
  
  lookup.flags = 0;
  lookup.loop = (uv_loop_t *)0x0;
  puVar4 = &uv__signal_tree;
  puVar5 = (uv_signal_t *)0x0;
  lookup.signum = signum;
  while (w2 = puVar4->rbh_root, w2 != (uv_signal_t *)0x0) {
    iVar1 = uv__signal_compare(&lookup,w2);
    lVar2 = 0x70;
    puVar3 = w2;
    if ((-1 < iVar1) && (lVar2 = 0x78, puVar3 = puVar5, iVar1 == 0)) goto LAB_0021aac4;
    puVar5 = puVar3;
    puVar4 = (uv__signal_tree_s *)((long)w2->handle_queue + lVar2 + -0x20);
  }
  w2 = puVar5;
  if (puVar5 != (uv_signal_t *)0x0) {
LAB_0021aac4:
    if (w2->signum == signum) {
      return w2;
    }
  }
  return (uv_signal_t *)0x0;
}

Assistant:

static uv_signal_t* uv__signal_first_handle(int signum) {
  /* This function must be called with the signal lock held. */
  uv_signal_t lookup;
  uv_signal_t* handle;

  lookup.signum = signum;
  lookup.flags = 0;
  lookup.loop = NULL;

  handle = RB_NFIND(uv__signal_tree_s, &uv__signal_tree, &lookup);

  if (handle != NULL && handle->signum == signum)
    return handle;

  return NULL;
}